

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary_element.cpp
# Opt level: O0

void __thiscall BoundaryElement::downward_pass(BoundaryElement *this,double *potential)

{
  double dVar1;
  double dVar2;
  double dVar3;
  value_type_conflict2 vVar4;
  int iVar5;
  size_type sVar6;
  reference pvVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  reference pvVar11;
  ulong uVar12;
  long lVar13;
  long in_RSI;
  undefined8 *in_RDI;
  unsigned_long *puVar14;
  double extraout_XMM0_Qa;
  double dVar15;
  Tree *extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  array<unsigned_long,_2UL> aVar16;
  double pot_temp_2;
  double pot_temp_1;
  double numerator;
  double dist_z_1;
  double dist_y_1;
  double dist_x_1;
  size_t kk;
  int k3;
  int k2;
  int k1;
  double pot_comp_dz;
  double pot_comp_dy;
  double pot_comp_dx;
  double pot_comp_;
  double denominator;
  double dist_z;
  double dist_y;
  double dist_x;
  int j;
  double zz;
  double yy;
  double xx;
  int exact_idx_z;
  int exact_idx_y;
  int exact_idx_x;
  double denominator_z;
  double denominator_y;
  double denominator_x;
  size_t i_1;
  size_t num_particles;
  size_t particle_start;
  size_t node_potentials_start;
  size_t node_interp_pts_start;
  array<unsigned_long,_2UL> particle_idxs;
  size_t node_idx;
  int num_interp_pts_per_node;
  size_t potential_offset;
  int i;
  int weights_num;
  double *weights_ptr;
  vector<double,_std::allocator<double>_> weights;
  double *targets_q_dz_ptr;
  double *targets_q_dy_ptr;
  double *targets_q_dx_ptr;
  double *targets_q_ptr;
  double *elements_z_ptr;
  double *elements_y_ptr;
  double *elements_x_ptr;
  double *clusters_p_dz_ptr;
  double *clusters_p_dy_ptr;
  double *clusters_p_dx_ptr;
  double *clusters_p_ptr;
  double *clusters_z_ptr;
  double *clusters_y_ptr;
  double *clusters_x_ptr;
  double in_stack_fffffffffffffda8;
  Tree *in_stack_fffffffffffffdb0;
  Timer *in_stack_fffffffffffffdc0;
  size_type in_stack_fffffffffffffdc8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdd0;
  double local_1d0;
  int local_1a4;
  int local_1a0;
  int local_19c;
  double local_198;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  int local_154;
  int local_134;
  int local_130;
  int local_12c;
  double local_128;
  double local_120;
  double local_118;
  ulong local_110;
  _Type local_e8;
  ulong local_d8;
  int local_cc;
  size_t local_c8;
  int local_c0;
  int local_bc;
  double *local_b8;
  vector<double,_std::allocator<double>_> local_98;
  double *local_80;
  double *local_78;
  double *local_70;
  double *local_68;
  double *local_60;
  double *local_58;
  double *local_50;
  double *local_48;
  double *local_40;
  double *local_38;
  double *local_30;
  double *local_28;
  double *local_20;
  double *local_18;
  long local_10;
  
  local_10 = in_RSI;
  Timer::start((Timer *)in_stack_fffffffffffffdb0);
  local_18 = InterpolationPoints::interp_x_ptr((InterpolationPoints *)0x129722);
  local_20 = InterpolationPoints::interp_y_ptr((InterpolationPoints *)0x12973b);
  local_28 = InterpolationPoints::interp_z_ptr((InterpolationPoints *)0x129754);
  local_30 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x12976d);
  local_38 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x129786);
  local_40 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x12979f);
  local_48 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x1297b8);
  local_50 = Particles::x_ptr((Particles *)0x1297d0);
  local_58 = Particles::y_ptr((Particles *)0x1297e8);
  local_60 = Particles::z_ptr((Particles *)0x129800);
  local_68 = Elements::target_charge_ptr((Elements *)0x129818);
  local_70 = Elements::target_charge_dx_ptr((Elements *)0x129830);
  local_78 = Elements::target_charge_dy_ptr((Elements *)0x129848);
  local_80 = Elements::target_charge_dz_ptr((Elements *)0x129860);
  InterpolationPoints::num_interp_pts_per_node((InterpolationPoints *)in_RDI[1]);
  std::allocator<double>::allocator((allocator<double> *)0x129890);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
             (allocator_type *)in_stack_fffffffffffffdc0);
  std::allocator<double>::~allocator((allocator<double> *)0x1298b6);
  local_b8 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x1298c3);
  sVar6 = std::vector<double,_std::allocator<double>_>::size(&local_98);
  local_bc = (int)sVar6;
  for (local_c0 = 0; local_c0 < local_bc; local_c0 = local_c0 + 1) {
    iVar5 = -1;
    if (local_c0 % 2 == 0) {
      iVar5 = 1;
    }
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_98,(long)local_c0);
    *pvVar7 = (double)iVar5;
    if ((local_c0 == 0) || (local_c0 == local_bc + -1)) {
      iVar5 = -1;
      if (local_c0 % 2 == 0) {
        iVar5 = 1;
      }
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_98,(long)local_c0);
      *pvVar7 = (double)iVar5 * 0.5;
    }
  }
  local_c8 = Particles::num((Particles *)*in_RDI);
  sVar8 = InterpolationPoints::num_interp_pts_per_node((InterpolationPoints *)in_RDI[1]);
  local_cc = (int)sVar8;
  local_d8 = 0;
  while( true ) {
    uVar12 = local_d8;
    sVar8 = Tree::num_nodes((Tree *)in_RDI[2]);
    if (sVar8 <= uVar12) break;
    aVar16 = Tree::node_particle_idxs(in_stack_fffffffffffffdb0,(size_t)in_stack_fffffffffffffda8);
    lVar9 = local_d8 * (long)local_cc;
    lVar10 = local_d8 * (long)*(int *)(in_RDI + 0xb);
    local_e8 = aVar16._M_elems;
    pvVar11 = std::array<unsigned_long,_2UL>::operator[]
                        ((array<unsigned_long,_2UL> *)in_stack_fffffffffffffdb0,
                         (size_type)in_stack_fffffffffffffda8);
    vVar4 = *pvVar11;
    pvVar11 = std::array<unsigned_long,_2UL>::operator[]
                        ((array<unsigned_long,_2UL> *)in_stack_fffffffffffffdb0,
                         (size_type)in_stack_fffffffffffffda8);
    in_stack_fffffffffffffdc0 = (Timer *)*pvVar11;
    puVar14 = local_e8;
    pvVar11 = std::array<unsigned_long,_2UL>::operator[]
                        ((array<unsigned_long,_2UL> *)in_stack_fffffffffffffdb0,
                         (size_type)in_stack_fffffffffffffda8);
    uVar12 = (long)in_stack_fffffffffffffdc0 - *pvVar11;
    for (local_110 = 0; local_110 < uVar12; local_110 = local_110 + 1) {
      local_118 = 0.0;
      local_120 = 0.0;
      local_128 = 0.0;
      local_12c = -1;
      local_130 = -1;
      local_134 = -1;
      dVar1 = local_50[vVar4 + local_110];
      dVar2 = local_58[vVar4 + local_110];
      dVar3 = local_60[vVar4 + local_110];
      for (local_154 = 0; local_154 < local_cc; local_154 = local_154 + 1) {
        local_118 = local_118 + local_b8[local_154] / (dVar1 - local_18[lVar9 + local_154]);
        local_120 = local_120 + local_b8[local_154] / (dVar2 - local_20[lVar9 + local_154]);
        local_128 = local_128 + local_b8[local_154] / (dVar3 - local_28[lVar9 + local_154]);
        std::abs((int)puVar14);
        dVar15 = std::numeric_limits<double>::min();
        if (extraout_XMM0_Qa < dVar15) {
          local_12c = local_154;
        }
        std::abs((int)puVar14);
        in_stack_fffffffffffffdb0 = extraout_XMM0_Qa_00;
        dVar15 = std::numeric_limits<double>::min();
        if ((double)in_stack_fffffffffffffdb0 < dVar15) {
          local_130 = local_154;
        }
        std::abs((int)puVar14);
        in_stack_fffffffffffffda8 = extraout_XMM0_Qa_01;
        dVar15 = std::numeric_limits<double>::min();
        if (in_stack_fffffffffffffda8 < dVar15) {
          local_134 = local_154;
        }
      }
      local_178 = 1.0;
      if (local_12c == -1) {
        local_178 = 1.0 / local_118;
      }
      if (local_130 == -1) {
        local_178 = local_178 / local_120;
      }
      if (local_134 == -1) {
        local_178 = local_178 / local_128;
      }
      local_180 = 0.0;
      local_188 = 0.0;
      local_190 = 0.0;
      local_198 = 0.0;
      for (local_19c = 0; local_19c < local_cc; local_19c = local_19c + 1) {
        for (local_1a0 = 0; local_1a0 < local_cc; local_1a0 = local_1a0 + 1) {
          for (local_1a4 = 0; local_1a4 < local_cc; local_1a4 = local_1a4 + 1) {
            lVar13 = lVar10 + local_19c * local_cc * local_cc + (long)(local_1a0 * local_cc) +
                     (long)local_1a4;
            local_1d0 = 1.0;
            if (local_12c == -1) {
              local_1d0 = (local_b8[local_19c] / (dVar1 - local_18[lVar9 + local_19c])) * 1.0;
            }
            else if (local_12c != local_19c) {
              local_1d0 = 0.0;
            }
            if (local_130 == -1) {
              local_1d0 = (local_b8[local_1a0] / (dVar2 - local_20[lVar9 + local_1a0])) * local_1d0;
            }
            else if (local_130 != local_1a0) {
              local_1d0 = local_1d0 * 0.0;
            }
            if (local_134 == -1) {
              local_1d0 = (local_b8[local_1a4] / (dVar3 - local_28[lVar9 + local_1a4])) * local_1d0;
            }
            else if (local_134 != local_1a4) {
              local_1d0 = local_1d0 * 0.0;
            }
            local_180 = local_1d0 * local_178 * local_30[lVar13] + local_180;
            local_188 = local_1d0 * local_178 * local_38[lVar13] + local_188;
            local_190 = local_1d0 * local_178 * local_40[lVar13] + local_190;
            local_198 = local_1d0 * local_178 * local_48[lVar13] + local_198;
          }
        }
      }
      dVar1 = local_70[vVar4 + local_110];
      dVar2 = local_78[vVar4 + local_110];
      dVar3 = local_80[vVar4 + local_110];
      *(double *)(local_10 + (vVar4 + local_110) * 8) =
           local_68[vVar4 + local_110] * local_180 + *(double *)(local_10 + (vVar4 + local_110) * 8)
      ;
      lVar13 = vVar4 + local_110 + local_c8;
      *(double *)(local_10 + lVar13 * 8) =
           dVar3 * local_198 + dVar1 * local_188 + dVar2 * local_190 +
           *(double *)(local_10 + lVar13 * 8);
    }
    local_d8 = local_d8 + 1;
  }
  Timer::stop(in_stack_fffffffffffffdc0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc0);
  return;
}

Assistant:

void BoundaryElement::downward_pass(double* __restrict potential)
{
    timers_.downward_pass.start();

    const double* __restrict clusters_x_ptr    = interp_pts_.interp_x_ptr();
    const double* __restrict clusters_y_ptr    = interp_pts_.interp_y_ptr();
    const double* __restrict clusters_z_ptr    = interp_pts_.interp_z_ptr();
    
    const double* __restrict clusters_p_ptr    = interp_potential_.data();
    const double* __restrict clusters_p_dx_ptr = interp_potential_dx_.data();
    const double* __restrict clusters_p_dy_ptr = interp_potential_dy_.data();
    const double* __restrict clusters_p_dz_ptr = interp_potential_dz_.data();
    
    const double* __restrict elements_x_ptr   = elements_.x_ptr();
    const double* __restrict elements_y_ptr   = elements_.y_ptr();
    const double* __restrict elements_z_ptr   = elements_.z_ptr();
    
    const double* __restrict targets_q_ptr     = elements_.target_charge_ptr();
    const double* __restrict targets_q_dx_ptr  = elements_.target_charge_dx_ptr();
    const double* __restrict targets_q_dy_ptr  = elements_.target_charge_dy_ptr();
    const double* __restrict targets_q_dz_ptr  = elements_.target_charge_dz_ptr();
    
    std::vector<double> weights (interp_pts_.num_interp_pts_per_node());
    double* weights_ptr = weights.data();
    int weights_num = weights.size();
    
    for (int i = 0; i < weights_num; ++i) {
        weights[i] = ((i % 2 == 0)? 1 : -1);
        if (i == 0 || i == weights_num-1) weights[i] = ((i % 2 == 0)? 1 : -1) * 0.5;
    }
    
    std::size_t potential_offset = elements_.num();
    int num_interp_pts_per_node = interp_pts_.num_interp_pts_per_node();
    
#ifdef OPENACC_ENABLED
#pragma acc enter data copyin(weights_ptr[0:weights_num])
#endif
    
    for (std::size_t node_idx = 0; node_idx < tree_.num_nodes(); ++node_idx) {
        
        auto particle_idxs = tree_.node_particle_idxs(node_idx);
        std::size_t node_interp_pts_start = node_idx * num_interp_pts_per_node;
        std::size_t node_potentials_start = node_idx * num_charges_per_node_;
        
        std::size_t particle_start = particle_idxs[0];
        std::size_t num_particles  = particle_idxs[1] - particle_idxs[0];

#ifdef OPENACC_ENABLED
        int stream_id = std::rand() % 3;
#pragma acc parallel loop async(stream_id) present(elements_x_ptr, elements_y_ptr, elements_z_ptr, \
                                  targets_q_ptr, targets_q_dx_ptr, targets_q_dy_ptr, targets_q_dz_ptr, \
                                  clusters_x_ptr, clusters_y_ptr, clusters_z_ptr, \
                                  clusters_p_ptr, clusters_p_dx_ptr, clusters_p_dy_ptr, clusters_p_dz_ptr, \
                                  potential, weights_ptr)
#endif
        for (std::size_t i = 0; i < num_particles; ++i) {
        
            double denominator_x = 0.;
            double denominator_y = 0.;
            double denominator_z = 0.;
            
            int exact_idx_x = -1;
            int exact_idx_y = -1;
            int exact_idx_z = -1;
            
            double xx = elements_x_ptr[particle_start + i];
            double yy = elements_y_ptr[particle_start + i];
            double zz = elements_z_ptr[particle_start + i];
            
#ifdef OPENACC_ENABLED
            #pragma acc loop reduction(+:denominator_x,denominator_y,denominator_z) \
                             reduction(max:exact_idx_x,exact_idx_y,exact_idx_z)
#endif
            for (int j = 0; j < num_interp_pts_per_node; ++j) {
            
                double dist_x = xx - clusters_x_ptr[node_interp_pts_start + j];
                double dist_y = yy - clusters_y_ptr[node_interp_pts_start + j];
                double dist_z = zz - clusters_z_ptr[node_interp_pts_start + j];
                
                denominator_x += weights_ptr[j] / dist_x;
                denominator_y += weights_ptr[j] / dist_y;
                denominator_z += weights_ptr[j] / dist_z;
                
                if (std::abs(dist_x) < std::numeric_limits<double>::min()) exact_idx_x = j;
                if (std::abs(dist_y) < std::numeric_limits<double>::min()) exact_idx_y = j;
                if (std::abs(dist_z) < std::numeric_limits<double>::min()) exact_idx_z = j;
            }
            
            double denominator = 1.;
            if (exact_idx_x == -1) denominator /= denominator_x;
            if (exact_idx_y == -1) denominator /= denominator_y;
            if (exact_idx_z == -1) denominator /= denominator_z;

            double pot_comp_   = 0.;
            double pot_comp_dx = 0.;
            double pot_comp_dy = 0.;
            double pot_comp_dz = 0.;
            
#ifdef OPENACC_ENABLED
            #pragma acc loop collapse(3) reduction(+:pot_comp_,  pot_comp_dx, \
                                                     pot_comp_dy,pot_comp_dz)
#endif
            for (int k1 = 0; k1 < num_interp_pts_per_node; ++k1) {
            for (int k2 = 0; k2 < num_interp_pts_per_node; ++k2) {
            for (int k3 = 0; k3 < num_interp_pts_per_node; ++k3) {
                    
                std::size_t kk = node_potentials_start
                               + k1 * num_interp_pts_per_node * num_interp_pts_per_node
                               + k2 * num_interp_pts_per_node + k3;
                               
                double dist_x = xx - clusters_x_ptr[node_interp_pts_start + k1];
                double dist_y = yy - clusters_y_ptr[node_interp_pts_start + k2];
                double dist_z = zz - clusters_z_ptr[node_interp_pts_start + k3];
                
                double numerator = 1.;

                // If exact_idx == -1, then no issues.
                // If exact_idx != -1, then we want to zero out terms EXCEPT when exactInd=k1.
                if (exact_idx_x == -1) {
                    numerator *= weights_ptr[k1] / dist_x;
                } else {
                    if (exact_idx_x != k1) numerator *= 0.;
                }

                if (exact_idx_y == -1) {
                    numerator *= weights_ptr[k2] / dist_y;
                } else {
                    if (exact_idx_y != k2) numerator *= 0.;
                }

                if (exact_idx_z == -1) {
                    numerator *= weights_ptr[k3] / dist_z;
                } else {
                    if (exact_idx_z != k3) numerator *= 0.;
                }

                pot_comp_   += numerator * denominator * clusters_p_ptr   [kk];
                pot_comp_dx += numerator * denominator * clusters_p_dx_ptr[kk];
                pot_comp_dy += numerator * denominator * clusters_p_dy_ptr[kk];
                pot_comp_dz += numerator * denominator * clusters_p_dz_ptr[kk];
            }
            }
            }
            
            double pot_temp_1 = targets_q_ptr   [particle_start + i] * pot_comp_;
            double pot_temp_2 = targets_q_dx_ptr[particle_start + i] * pot_comp_dx
                              + targets_q_dy_ptr[particle_start + i] * pot_comp_dy
                              + targets_q_dz_ptr[particle_start + i] * pot_comp_dz;
#ifdef OPENACC_ENABLED
            #pragma acc atomic update
#endif
            potential[particle_start + i]                    += pot_temp_1;
#ifdef OPENACC_ENABLED
            #pragma acc atomic update
#endif
            potential[particle_start + i + potential_offset] += pot_temp_2;
        }
    } //end loop over nodes
#ifdef OPENACC_ENABLED
    #pragma acc wait
    #pragma acc exit data delete(weights_ptr[0:weights_num])
#endif

    timers_.downward_pass.stop();
}